

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O0

BinaryOp __thiscall
wasm::OptimizeInstructions::invertBinaryOp(OptimizeInstructions *this,BinaryOp op)

{
  BinaryOp op_local;
  OptimizeInstructions *this_local;
  
  switch(op) {
  case EqInt32:
    this_local._4_4_ = NeInt32;
    break;
  case NeInt32:
    this_local._4_4_ = EqInt32;
    break;
  case LtSInt32:
    this_local._4_4_ = GeSInt32;
    break;
  case LtUInt32:
    this_local._4_4_ = GeUInt32;
    break;
  case LeSInt32:
    this_local._4_4_ = GtSInt32;
    break;
  case LeUInt32:
    this_local._4_4_ = GtUInt32;
    break;
  case GtSInt32:
    this_local._4_4_ = LeSInt32;
    break;
  case GtUInt32:
    this_local._4_4_ = LeUInt32;
    break;
  case GeSInt32:
    this_local._4_4_ = LtSInt32;
    break;
  case GeUInt32:
    this_local._4_4_ = LtUInt32;
    break;
  default:
    this_local._4_4_ = InvalidBinary;
    break;
  case EqInt64:
    this_local._4_4_ = NeInt64;
    break;
  case NeInt64:
    this_local._4_4_ = EqInt64;
    break;
  case LtSInt64:
    this_local._4_4_ = GeSInt64;
    break;
  case LtUInt64:
    this_local._4_4_ = GeUInt64;
    break;
  case LeSInt64:
    this_local._4_4_ = GtSInt64;
    break;
  case LeUInt64:
    this_local._4_4_ = GtUInt64;
    break;
  case GtSInt64:
    this_local._4_4_ = LeSInt64;
    break;
  case GtUInt64:
    this_local._4_4_ = LeUInt64;
    break;
  case GeSInt64:
    this_local._4_4_ = LtSInt64;
    break;
  case GeUInt64:
    this_local._4_4_ = LtUInt64;
    break;
  case EqFloat32:
    this_local._4_4_ = NeFloat32;
    break;
  case NeFloat32:
    this_local._4_4_ = EqFloat32;
    break;
  case EqFloat64:
    this_local._4_4_ = NeFloat64;
    break;
  case NeFloat64:
    this_local._4_4_ = EqFloat64;
  }
  return this_local._4_4_;
}

Assistant:

BinaryOp invertBinaryOp(BinaryOp op) {
    switch (op) {
      case EqInt32:
        return NeInt32;
      case NeInt32:
        return EqInt32;
      case LtSInt32:
        return GeSInt32;
      case LtUInt32:
        return GeUInt32;
      case LeSInt32:
        return GtSInt32;
      case LeUInt32:
        return GtUInt32;
      case GtSInt32:
        return LeSInt32;
      case GtUInt32:
        return LeUInt32;
      case GeSInt32:
        return LtSInt32;
      case GeUInt32:
        return LtUInt32;

      case EqInt64:
        return NeInt64;
      case NeInt64:
        return EqInt64;
      case LtSInt64:
        return GeSInt64;
      case LtUInt64:
        return GeUInt64;
      case LeSInt64:
        return GtSInt64;
      case LeUInt64:
        return GtUInt64;
      case GtSInt64:
        return LeSInt64;
      case GtUInt64:
        return LeUInt64;
      case GeSInt64:
        return LtSInt64;
      case GeUInt64:
        return LtUInt64;

      case EqFloat32:
        return NeFloat32;
      case NeFloat32:
        return EqFloat32;

      case EqFloat64:
        return NeFloat64;
      case NeFloat64:
        return EqFloat64;

      default:
        return InvalidBinary;
    }
  }